

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

EnumOptions * __thiscall
google::protobuf::EnumDescriptorProto::mutable_options(EnumDescriptorProto *this)

{
  EnumOptions *this_00;
  EnumDescriptorProto *this_local;
  
  set_has_options(this);
  if (this->options_ == (EnumOptions *)0x0) {
    this_00 = (EnumOptions *)operator_new(0x70);
    EnumOptions::EnumOptions(this_00);
    this->options_ = this_00;
  }
  return this->options_;
}

Assistant:

inline ::google::protobuf::EnumOptions* EnumDescriptorProto::mutable_options() {
  set_has_options();
  if (options_ == NULL) {
    options_ = new ::google::protobuf::EnumOptions;
  }
  // @@protoc_insertion_point(field_mutable:google.protobuf.EnumDescriptorProto.options)
  return options_;
}